

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

ZSTD_parameters *
ZSTD_getParams(ZSTD_parameters *__return_storage_ptr__,int compressionLevel,
              unsigned_long_long srcSizeHint,size_t dictSize)

{
  ZSTD_getCParams(&__return_storage_ptr__->cParams,compressionLevel,srcSizeHint,dictSize);
  (__return_storage_ptr__->fParams).checksumFlag = 0;
  (__return_storage_ptr__->fParams).noDictIDFlag = 0;
  (__return_storage_ptr__->fParams).contentSizeFlag = 1;
  return __return_storage_ptr__;
}

Assistant:

ZSTD_parameters ZSTD_getParams(int compressionLevel, unsigned long long srcSizeHint, size_t dictSize) {
    ZSTD_parameters params;
    ZSTD_compressionParameters const cParams = ZSTD_getCParams(compressionLevel, srcSizeHint, dictSize);
    DEBUGLOG(5, "ZSTD_getParams (cLevel=%i)", compressionLevel);
    memset(&params, 0, sizeof(params));
    params.cParams = cParams;
    params.fParams.contentSizeFlag = 1;
    return params;
}